

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4TranslatedPalCommand::Execute
          (DrawColumnRt4TranslatedPalCommand *this,DrawerThread *thread)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = (this->super_PalRtCommand).yl;
  uVar4 = DrawerThread::count_for_thread(thread,iVar5,((this->super_PalRtCommand).yh - iVar5) + 1);
  if (0 < (int)uVar4) {
    puVar2 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar5 = iVar5 << 2;
    puVar3 = (this->super_PalRtCommand)._translation;
    for (lVar6 = 0; uVar4 >> 1 != (uint)lVar6; lVar6 = lVar6 + 1) {
      uVar1 = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 1]];
      puVar2[lVar6 * 8 + (long)iVar5] = puVar3[puVar2[lVar6 * 8 + (long)iVar5]];
      puVar2[lVar6 * 8 + (long)iVar5 + 1] = uVar1;
      uVar1 = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 3]];
      puVar2[lVar6 * 8 + (long)iVar5 + 2] = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 2]];
      puVar2[lVar6 * 8 + (long)iVar5 + 3] = uVar1;
      uVar1 = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 5]];
      puVar2[lVar6 * 8 + (long)iVar5 + 4] = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 4]];
      puVar2[lVar6 * 8 + (long)iVar5 + 5] = uVar1;
      uVar1 = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 7]];
      puVar2[lVar6 * 8 + (long)iVar5 + 6] = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 6]];
      puVar2[lVar6 * 8 + (long)iVar5 + 7] = uVar1;
    }
    if ((uVar4 & 1) != 0) {
      uVar1 = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 1]];
      puVar2[lVar6 * 8 + (long)iVar5] = puVar3[puVar2[lVar6 * 8 + (long)iVar5]];
      puVar2[lVar6 * 8 + (long)iVar5 + 1] = uVar1;
      uVar1 = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 3]];
      puVar2[lVar6 * 8 + (long)iVar5 + 2] = puVar3[puVar2[lVar6 * 8 + (long)iVar5 + 2]];
      puVar2[lVar6 * 8 + (long)iVar5 + 3] = uVar1;
    }
  }
  return;
}

Assistant:

void DrawColumnRt4TranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		uint8_t *source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		const uint8_t *translation = _translation;
		int c0, c1;
		uint8_t b0, b1;

		// Do 2 rows at a time.
		for (int count8 = count >> 1; count8; --count8)
		{
			c0 = source[0];			c1 = source[1];
			b0 = translation[c0];	b1 = translation[c1];
			source[0] = b0;			source[1] = b1;

			c0 = source[2];			c1 = source[3];
			b0 = translation[c0];	b1 = translation[c1];
			source[2] = b0;			source[3] = b1;

			c0 = source[4];			c1 = source[5];
			b0 = translation[c0];	b1 = translation[c1];
			source[4] = b0;			source[5] = b1;

			c0 = source[6];			c1 = source[7];
			b0 = translation[c0];	b1 = translation[c1];
			source[6] = b0;			source[7] = b1;

			source += 8;
		}
		// Do the final row if count was odd.
		if (count & 1)
		{
			c0 = source[0];			c1 = source[1];
			b0 = translation[c0];	b1 = translation[c1];
			source[0] = b0;			source[1] = b1;

			c0 = source[2];			c1 = source[3];
			b0 = translation[c0];	b1 = translation[c1];
			source[2] = b0;			source[3] = b1;
		}
	}